

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IReporter * __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,ReporterConfig *config)

{
  const_iterator cVar1;
  IReporter *pIVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
          ::find(&(this->m_factories)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_factories)._M_t._M_impl.super__Rb_tree_header) {
    pIVar2 = (IReporter *)
             (**(code **)(**(long **)(cVar1._M_node + 2) + 0x10))
                       (*(long **)(cVar1._M_node + 2),config);
    return pIVar2;
  }
  return (IReporter *)0x0;
}

Assistant:

virtual IReporter* create( const std::string& name, const ReporterConfig& config ) const {
            FactoryMap::const_iterator it =  m_factories.find( name );
            if( it == m_factories.end() )
                return NULL;
            return it->second->create( config );
        }